

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 FindBestWindowPosForPopupEx
                 (ImVec2 *ref_pos,ImVec2 *size,ImGuiDir *last_dir,ImRect *r_outer,ImRect *r_avoid,
                 ImGuiPopupPositionPolicy policy)

{
  float fVar1;
  ulong uVar2;
  float fVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  ulong uVar6;
  ImVec2 *pIVar7;
  ImVec2 *pIVar8;
  uint uVar9;
  uint uVar10;
  float in_XMM0_Da;
  float in_XMM0_Db;
  ImVec2 IVar11;
  float fVar14;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float in_XMM1_Da;
  float in_XMM1_Db;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  ImVec2 IVar26;
  ImVec2 IVar27;
  
  fVar19 = ref_pos->x;
  fVar14 = ref_pos->y;
  uVar2 = *(ulong *)(last_dir + 2);
  fVar20 = (float)uVar2;
  fVar21 = (float)(uVar2 >> 0x20);
  fVar17 = (float)*(undefined8 *)last_dir;
  fVar18 = (float)((ulong)*(undefined8 *)last_dir >> 0x20);
  fVar3 = size->x;
  fVar1 = (r_outer->Min).x;
  if ((int)r_avoid == 1) {
    uVar6 = (ulong)(fVar3 == -NAN);
    fVar23 = (r_outer->Min).y;
    fVar22 = (r_outer->Max).x;
    IVar4.y = fVar23 - in_XMM1_Da;
    IVar4.x = fVar22 - in_XMM0_Da;
    fVar24 = (r_outer->Max).y;
    IVar5.y = fVar23 - in_XMM1_Da;
    IVar5.x = fVar1;
    IVar11.y = fVar24;
    IVar11.x = fVar1;
    pIVar8 = (ImVec2 *)(&DAT_001db9d0 + (ulong)(fVar3 != -NAN) * -4);
    do {
      pIVar7 = size;
      if (uVar6 != 0) {
        pIVar7 = pIVar8;
      }
      fVar15 = pIVar7->x;
      if ((uVar6 == 0) || (fVar15 != fVar3)) {
        switch(fVar15) {
        case 0.0:
          IVar26.y = fVar24;
          IVar26.x = fVar22 - in_XMM0_Da;
          break;
        case 1.4013e-45:
          IVar26 = IVar5;
          break;
        case 2.8026e-45:
          IVar26 = IVar4;
          break;
        case 4.2039e-45:
          IVar26 = IVar11;
          break;
        default:
          IVar26.x = 0.0;
          IVar26.y = 0.0;
        }
        if ((((fVar17 <= IVar26.x) && (fVar18 <= IVar26.y)) && (IVar26.x + in_XMM0_Da <= fVar20)) &&
           (IVar26.y + in_XMM1_Da <= fVar21)) {
          size->x = fVar15;
          return IVar26;
        }
      }
      uVar6 = uVar6 + 1;
      pIVar8 = (ImVec2 *)&pIVar8->y;
    } while (uVar6 != 5);
  }
  else {
    fVar23 = (r_outer->Min).y;
    fVar22 = (r_outer->Max).x;
    fVar24 = (r_outer->Max).y;
  }
  fVar15 = fVar21 - in_XMM1_Da;
  if (fVar14 <= fVar21 - in_XMM1_Da) {
    fVar15 = fVar14;
  }
  fVar14 = (float)(-(uint)(fVar14 < fVar18) & (uint)fVar18 |
                  ~-(uint)(fVar14 < fVar18) & (uint)fVar15);
  fVar15 = fVar20 - in_XMM0_Da;
  if (fVar19 <= fVar20 - in_XMM0_Da) {
    fVar15 = fVar19;
  }
  fVar19 = (float)(-(uint)(fVar19 < fVar17) & (uint)fVar17 |
                  ~-(uint)(fVar19 < fVar17) & (uint)fVar15);
  uVar6 = (ulong)(fVar3 == -NAN);
  pIVar8 = (ImVec2 *)(&DAT_001e0700 + (ulong)(fVar3 != -NAN) * -4);
  do {
    pIVar7 = size;
    if (uVar6 != 0) {
      pIVar7 = pIVar8;
    }
    fVar15 = pIVar7->x;
    if ((uVar6 == 0) || (fVar15 != fVar3)) {
      fVar25 = fVar1;
      if (fVar15 != 0.0) {
        fVar25 = fVar20;
      }
      fVar16 = fVar22;
      if (fVar15 != 1.4013e-45) {
        fVar16 = fVar17;
      }
      if (in_XMM0_Da <= fVar25 - fVar16) {
        fVar25 = fVar23;
        if (fVar15 != 2.8026e-45) {
          fVar25 = fVar21;
        }
        fVar16 = fVar24;
        if (fVar15 != 4.2039e-45) {
          fVar16 = fVar18;
        }
        if (in_XMM1_Da <= fVar25 - fVar16) {
          if (fVar15 == 0.0) {
            fVar22 = fVar1 - in_XMM0_Da;
          }
          else if (fVar15 != 1.4013e-45) {
            fVar22 = fVar19;
            if (fVar15 == 2.8026e-45) {
              fVar14 = (r_outer->Min).y - in_XMM1_Da;
            }
            else if (fVar15 == 4.2039e-45) {
              fVar14 = (r_outer->Max).y;
            }
          }
          IVar27.y = fVar14;
          IVar27.x = fVar22;
          size->x = fVar15;
          return IVar27;
        }
      }
    }
    uVar6 = uVar6 + 1;
    pIVar8 = (ImVec2 *)&pIVar8->y;
    if (uVar6 == 5) {
      size->x = -NAN;
      auVar12._0_4_ = (*ref_pos).x + in_XMM0_Da;
      auVar12._4_4_ = (*ref_pos).y + in_XMM1_Da;
      auVar12._8_4_ = in_XMM0_Db + 0.0;
      auVar12._12_4_ = in_XMM1_Db + 0.0;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar2;
      auVar13 = minps(auVar12,auVar13);
      fVar19 = auVar13._0_4_ - in_XMM0_Da;
      fVar14 = auVar13._4_4_ - in_XMM1_Da;
      uVar9 = -(uint)(fVar17 <= fVar19);
      uVar10 = -(uint)(fVar18 <= fVar14);
      return (ImVec2)(CONCAT44(~uVar10 & (uint)fVar18,~uVar9 & (uint)fVar17) |
                     CONCAT44((uint)fVar14 & uVar10,(uint)fVar19 & uVar9));
    }
  } while( true );
}

Assistant:

static ImVec2 FindBestWindowPosForPopupEx(const ImVec2& ref_pos, const ImVec2& size, ImGuiDir* last_dir, const ImRect& r_outer, const ImRect& r_avoid, ImGuiPopupPositionPolicy policy = ImGuiPopupPositionPolicy_Default)
{
    ImVec2 base_pos_clamped = ImClamp(ref_pos, r_outer.Min, r_outer.Max - size);
    //GImGui->OverlayDrawList.AddRect(r_avoid.Min, r_avoid.Max, IM_COL32(255,0,0,255));
    //GImGui->OverlayDrawList.AddRect(r_outer.Min, r_outer.Max, IM_COL32(0,255,0,255));

    // Combo Box policy (we want a connecting edge)
    if (policy == ImGuiPopupPositionPolicy_ComboBox)
    {
        const ImGuiDir dir_prefered_order[ImGuiDir_COUNT] = { ImGuiDir_Down, ImGuiDir_Right, ImGuiDir_Left, ImGuiDir_Up };
        for (int n = (*last_dir != ImGuiDir_None) ? -1 : 0; n < ImGuiDir_COUNT; n++)
        {
            const ImGuiDir dir = (n == -1) ? *last_dir : dir_prefered_order[n];
            if (n != -1 && dir == *last_dir) // Already tried this direction?
                continue;
            ImVec2 pos;
            if (dir == ImGuiDir_Down)  pos = ImVec2(r_avoid.Min.x, r_avoid.Max.y);          // Below, Toward Right (default)
            if (dir == ImGuiDir_Right) pos = ImVec2(r_avoid.Min.x, r_avoid.Min.y - size.y); // Above, Toward Right
            if (dir == ImGuiDir_Left)  pos = ImVec2(r_avoid.Max.x - size.x, r_avoid.Max.y); // Below, Toward Left
            if (dir == ImGuiDir_Up)    pos = ImVec2(r_avoid.Max.x - size.x, r_avoid.Min.y - size.y); // Above, Toward Left
            if (!r_outer.Contains(ImRect(pos, pos + size)))
                continue;
            *last_dir = dir;
            return pos;
        }
    }

    // Default popup policy
    const ImGuiDir dir_prefered_order[ImGuiDir_COUNT] = { ImGuiDir_Right, ImGuiDir_Down, ImGuiDir_Up, ImGuiDir_Left };
    for (int n = (*last_dir != ImGuiDir_None) ? -1 : 0; n < ImGuiDir_COUNT; n++)
    {
        const ImGuiDir dir = (n == -1) ? *last_dir : dir_prefered_order[n];
        if (n != -1 && dir == *last_dir) // Already tried this direction?
            continue;
        float avail_w = (dir == ImGuiDir_Left ? r_avoid.Min.x : r_outer.Max.x) - (dir == ImGuiDir_Right ? r_avoid.Max.x : r_outer.Min.x);
        float avail_h = (dir == ImGuiDir_Up ? r_avoid.Min.y : r_outer.Max.y) - (dir == ImGuiDir_Down ? r_avoid.Max.y : r_outer.Min.y);
        if (avail_w < size.x || avail_h < size.y)
            continue;
        ImVec2 pos;
        pos.x = (dir == ImGuiDir_Left) ? r_avoid.Min.x - size.x : (dir == ImGuiDir_Right) ? r_avoid.Max.x : base_pos_clamped.x;
        pos.y = (dir == ImGuiDir_Up)   ? r_avoid.Min.y - size.y : (dir == ImGuiDir_Down)  ? r_avoid.Max.y : base_pos_clamped.y;
        *last_dir = dir;
        return pos;
    }

    // Fallback, try to keep within display
    *last_dir = ImGuiDir_None;
    ImVec2 pos = ref_pos;
    pos.x = ImMax(ImMin(pos.x + size.x, r_outer.Max.x) - size.x, r_outer.Min.x);
    pos.y = ImMax(ImMin(pos.y + size.y, r_outer.Max.y) - size.y, r_outer.Min.y);
    return pos;
}